

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

int lj_gc_step(lua_State *L)

{
  undefined4 uVar1;
  uint64_t uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar2 = (L->glref).ptr64;
  uVar1 = *(undefined4 *)(uVar2 + 0xb8);
  *(undefined4 *)(uVar2 + 0xb8) = 0xfffffffd;
  uVar4 = *(int *)(uVar2 + 0x68) * 10;
  uVar8 = 0x800000000000;
  if (uVar4 != 0) {
    uVar8 = (ulong)uVar4;
  }
  lVar6 = *(ulong *)(uVar2 + 0x10) - *(ulong *)(uVar2 + 0x18);
  if (*(ulong *)(uVar2 + 0x18) <= *(ulong *)(uVar2 + 0x10) && lVar6 != 0) {
    *(long *)(uVar2 + 0x58) = *(long *)(uVar2 + 0x58) + lVar6;
  }
  do {
    sVar7 = gc_onestep(L);
    if (*(char *)(uVar2 + 0x21) == '\0') {
      lVar6 = (ulong)*(uint *)(uVar2 + 0x6c) * (*(ulong *)(uVar2 + 0x60) / 100);
      iVar5 = 1;
      goto LAB_00126ad1;
    }
    uVar9 = uVar8 - sVar7;
    bVar3 = (long)sVar7 <= (long)uVar8;
    uVar8 = uVar9;
  } while (uVar9 != 0 && bVar3);
  if (*(ulong *)(uVar2 + 0x58) < 0x400) {
    lVar6 = *(long *)(uVar2 + 0x10) + 0x400;
    iVar5 = -1;
  }
  else {
    *(ulong *)(uVar2 + 0x58) = *(ulong *)(uVar2 + 0x58) - 0x400;
    lVar6 = *(long *)(uVar2 + 0x10);
    iVar5 = 0;
  }
LAB_00126ad1:
  *(long *)(uVar2 + 0x18) = lVar6;
  *(undefined4 *)(uVar2 + 0xb8) = uVar1;
  return iVar5;
}

Assistant:

int LJ_FASTCALL lj_gc_step(lua_State *L)
{
  global_State *g = G(L);
  GCSize lim;
  int32_t ostate = g->vmstate;
  setvmstate(g, GC);
  lim = (GCSTEPSIZE/100) * g->gc.stepmul;
  if (lim == 0)
    lim = LJ_MAX_MEM;
  if (g->gc.total > g->gc.threshold)
    g->gc.debt += g->gc.total - g->gc.threshold;
  do {
    lim -= (GCSize)gc_onestep(L);
    if (g->gc.state == GCSpause) {
      g->gc.threshold = (g->gc.estimate/100) * g->gc.pause;
      g->vmstate = ostate;
      return 1;  /* Finished a GC cycle. */
    }
  } while (sizeof(lim) == 8 ? ((int64_t)lim > 0) : ((int32_t)lim > 0));
  if (g->gc.debt < GCSTEPSIZE) {
    g->gc.threshold = g->gc.total + GCSTEPSIZE;
    g->vmstate = ostate;
    return -1;
  } else {
    g->gc.debt -= GCSTEPSIZE;
    g->gc.threshold = g->gc.total;
    g->vmstate = ostate;
    return 0;
  }
}